

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall bssl::anon_unknown_0::SSLTest_SetBIO_Test::TestBody(SSLTest_SetBIO_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  SSL *pSVar4;
  BIO_METHOD *pBVar5;
  BIO *pBVar6;
  pointer pbVar7;
  BIO *pBVar8;
  char *in_R9;
  string local_190;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIO> bio3;
  UniquePtr<BIO> bio2;
  UniquePtr<BIO> bio1;
  UniquePtr<SSL> ssl;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  SSLTest_SetBIO_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd6b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    pSVar4 = SSL_new((SSL_CTX *)psVar2);
    std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&bio1,(pointer)pSVar4);
    pBVar5 = BIO_s_mem();
    pBVar6 = BIO_new(pBVar5);
    std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bio_st,bssl::internal::Deleter> *)&bio2,(pointer)pBVar6);
    pBVar5 = BIO_s_mem();
    pBVar6 = BIO_new(pBVar5);
    std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bio_st,bssl::internal::Deleter> *)&bio3,(pointer)pBVar6);
    pBVar5 = BIO_s_mem();
    pBVar6 = BIO_new(pBVar5);
    std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)pBVar6);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_a0,(unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a0,(AssertionResult *)0x4e465b,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd70,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (bVar1) {
      testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_e0,&bio2,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_e0,(AssertionResult *)"bio1",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xd71,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (bVar1) {
        testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_120,&bio3,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_120,(AssertionResult *)"bio2"
                     ,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xd72,pcVar3);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
        if (bVar1) {
          testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_190,(internal *)local_160,(AssertionResult *)"bio3","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xd73,pcVar3);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            BIO_up_ref(pbVar7);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio3);
            BIO_up_ref(pbVar7);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                               );
            BIO_up_ref(pbVar7);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio3);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio3);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            BIO_up_ref(pbVar7);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio3);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                               );
            BIO_up_ref(pbVar7);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            BIO_up_ref(pbVar7);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            BIO_up_ref(pbVar7);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio3);
            BIO_up_ref(pbVar7);
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio3);
            pBVar8 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&bio2);
            SSL_set_bio(pSVar4,pBVar6,pBVar8);
          }
        }
      }
    }
    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio3);
    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio2);
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&bio1);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, SetBIO) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  bssl::UniquePtr<BIO> bio1(BIO_new(BIO_s_mem())), bio2(BIO_new(BIO_s_mem())),
      bio3(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(ssl);
  ASSERT_TRUE(bio1);
  ASSERT_TRUE(bio2);
  ASSERT_TRUE(bio3);

  // SSL_set_bio takes one reference when the parameters are the same.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // Repeating the call does nothing.
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // It takes one reference each when the parameters are different.
  BIO_up_ref(bio2.get());
  BIO_up_ref(bio3.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio3.get());

  // Repeating the call does nothing.
  SSL_set_bio(ssl.get(), bio2.get(), bio3.get());

  // It takes one reference when changing only wbio.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio1.get());

  // It takes one reference when changing only rbio and the two are different.
  BIO_up_ref(bio3.get());
  SSL_set_bio(ssl.get(), bio3.get(), bio1.get());

  // If setting wbio to rbio, it takes no additional references.
  SSL_set_bio(ssl.get(), bio3.get(), bio3.get());

  // From there, wbio may be switched to something else.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio3.get(), bio1.get());

  // If setting rbio to wbio, it takes no additional references.
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // From there, rbio may be switched to something else, but, for historical
  // reasons, it takes a reference to both parameters.
  BIO_up_ref(bio1.get());
  BIO_up_ref(bio2.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio1.get());

  // ASAN builds will implicitly test that the internal |BIO| reference-counting
  // is correct.
}